

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmBitFieldDn<(moira::Instr)141,(moira::Mode)0,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 *this_00;
  bool bVar1;
  uint uVar2;
  StrWriter *pSVar3;
  Av<(moira::Instr)141,_(moira::Mode)0,_4> local_6c;
  Dn local_68;
  Dn local_64;
  Dn local_60;
  Dn local_5c;
  Dn local_58;
  Dn local_54;
  Dn local_50;
  Dn local_4c;
  Ea<(moira::Mode)0,_4> local_48;
  int local_34;
  byte local_2f;
  byte local_2e;
  byte local_2d;
  u32 local_2c;
  u8 w;
  u8 o;
  u32 uStack_28;
  u8 dst;
  u32 ext;
  u32 old;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  uStack_28 = *addr;
  ext._2_2_ = op;
  _old = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  local_2c = dasmIncRead<2>(this,addr);
  local_2d = (byte)ext._2_2_ & 7;
  local_2e = (byte)(local_2c >> 6) & 0x1f;
  local_2f = (byte)local_2c & 0x1f;
  if (((**(int **)(addr_local + 0xc) != 2) && (**(int **)(addr_local + 0xc) != 3)) ||
     (bVar1 = isValidExt(this,BFTST,DN,ext._2_2_,local_2c), bVar1)) {
    pSVar3 = StrWriter::operator<<((StrWriter *)addr_local);
    local_34 = addr_local[0xe];
    StrWriter::operator<<(pSVar3,(Tab)local_34);
    this_00 = addr_local;
    Op<(moira::Mode)0,4>(&local_48,this,(ushort)local_2d,_old);
    StrWriter::operator<<((StrWriter *)this_00,&local_48);
    if (**(int **)(addr_local + 0xc) == 2 || **(int **)(addr_local + 0xc) == 3) {
      uVar2 = local_2c & 0x820;
      if (uVar2 == 0) {
        pSVar3 = StrWriter::operator<<((StrWriter *)addr_local,",");
        pSVar3 = StrWriter::operator<<(pSVar3,(uint)local_2e);
        pSVar3 = StrWriter::operator<<(pSVar3,",");
        StrWriter::operator<<(pSVar3,(uint)local_2f);
      }
      else if (uVar2 == 0x20) {
        pSVar3 = StrWriter::operator<<((StrWriter *)addr_local,",");
        pSVar3 = StrWriter::operator<<(pSVar3,(uint)local_2e);
        pSVar3 = StrWriter::operator<<(pSVar3,",");
        Dn::Dn(&local_4c,local_2f & 7);
        StrWriter::operator<<(pSVar3,local_4c);
      }
      else if (uVar2 == 0x800) {
        pSVar3 = StrWriter::operator<<((StrWriter *)addr_local,",");
        Dn::Dn(&local_50,local_2e & 7);
        pSVar3 = StrWriter::operator<<(pSVar3,local_50);
        pSVar3 = StrWriter::operator<<(pSVar3,",");
        StrWriter::operator<<(pSVar3,(uint)local_2f);
      }
      else if (uVar2 == 0x820) {
        pSVar3 = StrWriter::operator<<((StrWriter *)addr_local,",");
        Dn::Dn(&local_54,local_2e & 7);
        pSVar3 = StrWriter::operator<<(pSVar3,local_54);
        pSVar3 = StrWriter::operator<<(pSVar3,",");
        Dn::Dn(&local_58,local_2f & 7);
        StrWriter::operator<<(pSVar3,local_58);
      }
    }
    else {
      if (local_2f == 0) {
        local_2f = 0x20;
      }
      uVar2 = local_2c & 0x820;
      if (uVar2 == 0) {
        pSVar3 = StrWriter::operator<<((StrWriter *)addr_local," {");
        pSVar3 = StrWriter::operator<<(pSVar3,(uint)local_2e);
        pSVar3 = StrWriter::operator<<(pSVar3,":");
        pSVar3 = StrWriter::operator<<(pSVar3,(uint)local_2f);
        StrWriter::operator<<(pSVar3,"}");
      }
      else if (uVar2 == 0x20) {
        pSVar3 = StrWriter::operator<<((StrWriter *)addr_local," {");
        pSVar3 = StrWriter::operator<<(pSVar3,(uint)local_2e);
        pSVar3 = StrWriter::operator<<(pSVar3,":");
        Dn::Dn(&local_5c,local_2f & 7);
        pSVar3 = StrWriter::operator<<(pSVar3,local_5c);
        StrWriter::operator<<(pSVar3,"}");
      }
      else if (uVar2 == 0x800) {
        pSVar3 = StrWriter::operator<<((StrWriter *)addr_local," {");
        Dn::Dn(&local_60,local_2e & 7);
        pSVar3 = StrWriter::operator<<(pSVar3,local_60);
        pSVar3 = StrWriter::operator<<(pSVar3,":");
        pSVar3 = StrWriter::operator<<(pSVar3,(uint)local_2f);
        StrWriter::operator<<(pSVar3,"}");
      }
      else if (uVar2 == 0x820) {
        pSVar3 = StrWriter::operator<<((StrWriter *)addr_local," {");
        Dn::Dn(&local_64,local_2e & 7);
        pSVar3 = StrWriter::operator<<(pSVar3,local_64);
        pSVar3 = StrWriter::operator<<(pSVar3,":");
        Dn::Dn(&local_68,local_2f & 7);
        pSVar3 = StrWriter::operator<<(pSVar3,local_68);
        StrWriter::operator<<(pSVar3,"}");
      }
    }
    local_6c.ext1 = 0;
    StrWriter::operator<<((StrWriter *)addr_local,&local_6c);
  }
  else {
    *_old = uStack_28;
    dasmIllegal<(moira::Instr)141,(moira::Mode)0,4>(this,(StrWriter *)addr_local,_old,ext._2_2_);
  }
  return;
}

Assistant:

void
Moira::dasmBitFieldDn(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word>(addr);
    auto dst = _____________xxx(op);
    auto o   = _____xxxxx______(ext);
    auto w   = ___________xxxxx(ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << str.tab;

    if constexpr (I == Instr::BFINS) {
        str << Dn ( _xxx____________(ext) ) << Sep{};
    }

    str << Op<M, S>(dst, addr);

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            switch (ext & 0x0820) {

                case 0x0000: str << "," << o << "," << w; break;
                case 0x0020: str << "," << o << "," << Dn{w&7}; break;
                case 0x0800: str << "," << Dn{o&7} << "," << w; break;
                case 0x0820: str << "," << Dn{o&7} << "," << Dn{w&7}; break;
            }
            break;

        default:

            if (w == 0) w = 32;

            switch (ext & 0x0820) {

                case 0x0000: str << " {" << o << ":" << w << "}"; break;
                case 0x0020: str << " {" << o << ":" << Dn{w&7} << "}"; break;
                case 0x0800: str << " {" << Dn{o&7} << ":" << w << "}"; break;
                case 0x0820: str << " {" << Dn{o&7} << ":" << Dn{w&7} << "}"; break;
            }
    }

    if constexpr (I == Instr::BFEXTU || I == Instr::BFEXTS || I == Instr::BFFFO) {
        str << Sep{} << Dn ( _xxx____________(ext) );
    }
    str << Av<I, M, S>{};
}